

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<SafeSymbols>::moveAppend
          (QGenericArrayOps<SafeSymbols> *this,SafeSymbols *b,SafeSymbols *e)

{
  SafeSymbols *pSVar1;
  Data *pDVar2;
  Symbol *pSVar3;
  qsizetype qVar4;
  Data *pDVar5;
  char *pcVar6;
  Data *pDVar7;
  qsizetype qVar8;
  
  if ((b != e) && (b < e)) {
    pSVar1 = (this->super_QArrayDataPointer<SafeSymbols>).ptr;
    qVar8 = (this->super_QArrayDataPointer<SafeSymbols>).size;
    do {
      pDVar2 = (b->symbols).d.d;
      (b->symbols).d.d = (Data *)0x0;
      pSVar1[qVar8].symbols.d.d = pDVar2;
      pSVar3 = (b->symbols).d.ptr;
      (b->symbols).d.ptr = (Symbol *)0x0;
      pSVar1[qVar8].symbols.d.ptr = pSVar3;
      qVar4 = (b->symbols).d.size;
      (b->symbols).d.size = 0;
      pSVar1[qVar8].symbols.d.size = qVar4;
      pDVar5 = (b->expandedMacro).d.d;
      (b->expandedMacro).d.d = (Data *)0x0;
      pSVar1[qVar8].expandedMacro.d.d = pDVar5;
      pcVar6 = (b->expandedMacro).d.ptr;
      (b->expandedMacro).d.ptr = (char *)0x0;
      pSVar1[qVar8].expandedMacro.d.ptr = pcVar6;
      qVar4 = (b->expandedMacro).d.size;
      (b->expandedMacro).d.size = 0;
      pSVar1[qVar8].expandedMacro.d.size = qVar4;
      pDVar7 = (b->excludedSymbols).q_hash.d;
      (b->excludedSymbols).q_hash.d = (Data *)0x0;
      pSVar1[qVar8].excludedSymbols.q_hash.d = pDVar7;
      pSVar1[qVar8].index = b->index;
      b = b + 1;
      qVar8 = (this->super_QArrayDataPointer<SafeSymbols>).size + 1;
      (this->super_QArrayDataPointer<SafeSymbols>).size = qVar8;
    } while (b < e);
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }